

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

FileTypeEnum
cmsys::SystemTools::DetectFileType(char *filename,unsigned_long length,double percent_bin)

{
  FILE *pFVar1;
  uchar *__ptr;
  size_t sVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double current_percent_bin;
  uchar *buffer_end;
  uchar *ptr;
  size_t text_count;
  size_t read_length;
  uchar *buffer;
  allocator local_51;
  string local_50;
  FILE *local_30;
  FILE *fp;
  double percent_bin_local;
  unsigned_long length_local;
  char *filename_local;
  
  if ((filename == (char *)0x0) || (percent_bin < 0.0)) {
    filename_local._4_4_ = FileTypeUnknown;
  }
  else {
    fp = (FILE *)percent_bin;
    percent_bin_local = (double)length;
    length_local = (unsigned_long)filename;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_50,filename,&local_51);
    pFVar1 = (FILE *)Fopen(&local_50,"rb");
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    if (pFVar1 == (FILE *)0x0) {
      filename_local._4_4_ = FileTypeUnknown;
    }
    else {
      local_30 = pFVar1;
      __ptr = (uchar *)operator_new__((ulong)percent_bin_local);
      sVar2 = fread(__ptr,1,(size_t)percent_bin_local,local_30);
      fclose(local_30);
      if (sVar2 == 0) {
        filename_local._4_4_ = FileTypeUnknown;
      }
      else {
        ptr = (uchar *)0x0;
        for (buffer_end = __ptr; buffer_end != __ptr + sVar2; buffer_end = buffer_end + 1) {
          if ((((0x1f < *buffer_end) && (*buffer_end < 0x80)) || (*buffer_end == '\n')) ||
             ((*buffer_end == '\r' || (*buffer_end == '\t')))) {
            ptr = ptr + 1;
          }
        }
        if (__ptr != (uchar *)0x0) {
          operator_delete__(__ptr);
        }
        lVar3 = sVar2 - (long)ptr;
        auVar4._8_4_ = (int)((ulong)lVar3 >> 0x20);
        auVar4._0_8_ = lVar3;
        auVar4._12_4_ = 0x45300000;
        auVar5._8_4_ = (int)(sVar2 >> 0x20);
        auVar5._0_8_ = sVar2;
        auVar5._12_4_ = 0x45300000;
        if (((auVar4._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) /
            ((auVar5._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)) < (double)fp) {
          filename_local._4_4_ = FileTypeText;
        }
        else {
          filename_local._4_4_ = FileTypeBinary;
        }
      }
    }
  }
  return filename_local._4_4_;
}

Assistant:

SystemTools::FileTypeEnum
SystemTools::DetectFileType(const char *filename,
                            unsigned long length,
                            double percent_bin)
{
  if (!filename || percent_bin < 0)
    {
    return SystemTools::FileTypeUnknown;
    }

  FILE *fp = Fopen(filename, "rb");
  if (!fp)
    {
    return SystemTools::FileTypeUnknown;
    }

  // Allocate buffer and read bytes

  unsigned char *buffer = new unsigned char [length];
  size_t read_length = fread(buffer, 1, length, fp);
  fclose(fp);
  if (read_length == 0)
    {
    return SystemTools::FileTypeUnknown;
    }

  // Loop over contents and count

  size_t text_count = 0;

  const unsigned char *ptr = buffer;
  const unsigned char *buffer_end = buffer + read_length;

  while (ptr != buffer_end)
    {
    if ((*ptr >= 0x20 && *ptr <= 0x7F) ||
        *ptr == '\n' ||
        *ptr == '\r' ||
        *ptr == '\t')
      {
      text_count++;
      }
    ptr++;
    }

  delete [] buffer;

  double current_percent_bin =
    (static_cast<double>(read_length - text_count) /
     static_cast<double>(read_length));

  if (current_percent_bin >= percent_bin)
    {
    return SystemTools::FileTypeBinary;
    }

  return SystemTools::FileTypeText;
}